

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O2

void __thiscall reader_url_suite::test_path_absolute_two::test_method(test_path_absolute_two *this)

{
  bool bVar1;
  uint local_368;
  value local_364;
  view_type local_360;
  undefined8 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  url reader;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char input [17];
  
  local_360.ptr_ = input;
  builtin_strncpy(input,"scheme:/path/two",0x11);
  local_360.len_ = strlen(local_360.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_360);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0xae);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_70 = "";
  local_364 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_368 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_360,&local_78,0xae,2,2,&local_364,"reader.subcode()",&local_368,
             "url::token::subcode::scheme");
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0xaf);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_a0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[7]>
            (&local_360,&local_a8,0xaf,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"scheme","\"scheme\"");
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0xb0);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2f8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_364 = CONCAT31(local_364._1_3_,bVar1);
  local_368 = CONCAT31(local_368._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_360,&local_300,0xb0,2,2,&local_364,"reader.next()",&local_368,"true");
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0xb1);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_308 = "";
  local_364 = trial::url::token::category
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_368 = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::category::value,trial::url::token::category::value>
            (&local_360,&local_310,0xb1,2,2,&local_364,"reader.category()",&local_368,
             "url::token::category::path");
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0xb2);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  local_364 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_368 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_360,&local_118,0xb2,2,2,&local_364,"reader.code()",&local_368,
             "url::token::code::path_segment");
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0xb3);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_364 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_368 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_360,&local_148,0xb3,2,2,&local_364,"reader.subcode()",&local_368,
             "url::token::subcode::path_segment");
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0xb4);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_170 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
            (&local_360,&local_178,0xb4,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"path","\"path\"");
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0xb5);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_318 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_364 = CONCAT31(local_364._1_3_,bVar1);
  local_368 = CONCAT31(local_368._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_360,&local_320,0xb5,2,2,&local_364,"reader.next()",&local_368,"true");
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0xb6);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_328 = "";
  local_364 = trial::url::token::category
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_368 = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::category::value,trial::url::token::category::value>
            (&local_360,&local_330,0xb6,2,2,&local_364,"reader.category()",&local_368,
             "url::token::category::path");
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0xb7);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1e0 = "";
  local_364 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_368 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_360,&local_1e8,0xb7,2,2,&local_364,"reader.code()",&local_368,
             "url::token::code::path_segment");
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0xb8);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_210 = "";
  local_364 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_368 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_360,&local_218,0xb8,2,2,&local_364,"reader.subcode()",&local_368,
             "url::token::subcode::path_segment");
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0xb9);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_240 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[4]>
            (&local_360,&local_248,0xb9,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"two","\"two\"");
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_250 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0xba);
  local_360.len_ = local_360.len_ & 0xffffffffffffff00;
  local_360.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_350 = &boost::unit_test::lazy_ostream::inst;
  local_348 = "";
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_338 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_364 = CONCAT31(local_364._1_3_,bVar1);
  local_368 = local_368 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_360,&local_340,0xba,2,2,&local_364,"reader.next()",&local_368,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_absolute_two)
{
    const char input[] = "scheme:/path/two";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "two");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}